

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.cpp
# Opt level: O0

void __thiscall hta::Meta::Meta(Meta *this,json *config)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar2;
  size_type sVar3;
  const_reference pvVar4;
  long lVar5;
  rep rVar6;
  rep local_48;
  rep local_40;
  int local_34;
  duration<long,_std::ratio<3600L,_1L>_> local_30;
  int local_24;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  json *local_18;
  json *config_local;
  Meta *this_local;
  
  local_24 = 10;
  local_18 = config;
  config_local = (json *)this;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_20,&local_24);
  dVar2 = duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (&local_20);
  (this->interval_min).__r = dVar2.__r;
  local_34 = 0x2238;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
            ((duration<long,std::ratio<3600l,1l>> *)&local_30,&local_34);
  dVar2 = duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (&local_30);
  (this->interval_max).__r = dVar2.__r;
  this->interval_factor = 10;
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[13]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)local_18,(char (*) [13])"interval_min");
  if (sVar3 != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_18,"interval_min");
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_40,pvVar4);
    (this->interval_min).__r = local_40;
  }
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[16]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)local_18,(char (*) [16])"interval_factor");
  if (sVar3 != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_18,"interval_factor");
    lVar5 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_long<long,_0>(pvVar4);
    this->interval_factor = lVar5;
  }
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[13]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)local_18,(char (*) [13])0x213fa2);
  if (sVar3 != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_18,"interval_max");
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_48,pvVar4);
    (this->interval_max).__r = local_48;
  }
  rVar6 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    (&this->interval_min);
  if (rVar6 % this->interval_factor != 0) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,long>
              ("interval_min of ",
               (duration<long,_std::ratio<1L,_1000000000L>_>)(this->interval_min).__r,
               " not divisible by ",this->interval_factor);
  }
  rVar6 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    (&this->interval_min);
  if (rVar6 < 1) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ("interval_min not positive ",
               (duration<long,_std::ratio<1L,_1000000000L>_>)(this->interval_min).__r);
  }
  bVar1 = std::chrono::operator<(&this->interval_max,&this->interval_min);
  if (!bVar1) {
    return;
  }
  throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*>
            ("interval_max (",(duration<long,_std::ratio<1L,_1000000000L>_>)(this->interval_max).__r
             ,")not larger than interval_min (",
             (duration<long,_std::ratio<1L,_1000000000L>_>)(this->interval_min).__r,")");
}

Assistant:

Meta::Meta(const json& config)
{
    if (config.count("interval_min"))
    {
        interval_min = Duration(config["interval_min"]);
    }
    if (config.count("interval_factor"))
    {
        interval_factor = config["interval_factor"];
    }
    if (config.count("interval_max"))
    {
        interval_max = Duration(config["interval_max"]);
    }
    if (interval_min.count() % interval_factor != 0)
    {
        throw_exception("interval_min of ", interval_min, " not divisible by ", interval_factor);
    }
    if (interval_min.count() <= 0)
    {
        throw_exception("interval_min not positive ", interval_min);
    }
    if (interval_max < interval_min)
    {
        throw_exception("interval_max (", interval_max, ")not larger than interval_min (",
                        interval_min, ")");
    }
}